

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ons_test.cc
# Opt level: O0

int test_ons_cloud_get_appkey_list(void)

{
  code *pcVar1;
  char *__s;
  Ons *pOVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_239;
  int ret;
  HttpTestListener *local_218;
  HttpTestListener *listener;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0 [39];
  allocator<char> local_1b9;
  string local_1b8 [55];
  allocator<char> local_181;
  string local_180 [32];
  Ons *local_160;
  Ons *ons;
  OnsOnsCloudGetAppkeyListResponseType resp;
  OnsOnsCloudGetAppkeyListRequestType req;
  
  aliyun::OnsOnsCloudGetAppkeyListRequestType::OnsOnsCloudGetAppkeyListRequestType
            ((OnsOnsCloudGetAppkeyListRequestType *)((long)&resp.help_url.field_2 + 8));
  aliyun::OnsOnsCloudGetAppkeyListResponseType::OnsOnsCloudGetAppkeyListResponseType
            ((OnsOnsCloudGetAppkeyListResponseType *)&ons);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_180,"cn-hangzhou",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,"my_appid",&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"my_secret",&local_1e1);
  pOVar2 = (Ons *)aliyun::Ons::CreateOnsClient(local_180,local_1b8,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  local_160 = pOVar2;
  if (pOVar2 == (Ons *)0x0) {
    aliyun::OnsOnsCloudGetAppkeyListResponseType::~OnsOnsCloudGetAppkeyListResponseType
              ((OnsOnsCloudGetAppkeyListResponseType *)&ons);
    aliyun::OnsOnsCloudGetAppkeyListRequestType::~OnsOnsCloudGetAppkeyListRequestType
              ((OnsOnsCloudGetAppkeyListRequestType *)((long)&resp.help_url.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Ons::SetProxyHost(pOVar2,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Ons::SetUseTls(local_160,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_ons_cloud_get_appkey_list_response;
  local_218 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_239);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_239);
  HttpTestListener::Start(local_218);
  std::__cxx11::string::operator=((string *)(resp.help_url.field_2._M_local_buf + 8),"OnsRegionId");
  std::__cxx11::string::operator=
            ((string *)(req.ons_region_id.field_2._M_local_buf + 8),"OnsPlatform");
  std::__cxx11::string::operator=
            ((string *)(req.ons_platform.field_2._M_local_buf + 8),"PreventCache");
  std::__cxx11::string::operator=((string *)(req.prevent_cache.field_2._M_local_buf + 8),"IsvId");
  aliyun::Ons::OnsCloudGetAppkeyList
            (local_160,(OnsOnsCloudGetAppkeyListRequestType *)((long)&resp.help_url.field_2 + 8),
             (OnsOnsCloudGetAppkeyListResponseType *)&ons,(OnsErrorInfo *)0x0);
  HttpTestListener::WaitComplete(local_218);
  pHVar3 = local_218;
  if (local_218 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_218);
    operator_delete(pHVar3,0x180);
  }
  pOVar2 = local_160;
  if (local_160 != (Ons *)0x0) {
    aliyun::Ons::~Ons(local_160);
    operator_delete(pOVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_ons_cloud_get_appkey_list() {
  OnsOnsCloudGetAppkeyListRequestType req;
  OnsOnsCloudGetAppkeyListResponseType resp;
  Ons* ons = Ons::CreateOnsClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ons) return 0;
  ons->SetProxyHost("127.0.0.1:12234");
  ons->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_ons_cloud_get_appkey_list_response);
  listener->Start();
  req.ons_region_id = "OnsRegionId";
  req.ons_platform = "OnsPlatform";
  req.prevent_cache = "PreventCache";
  req.isv_id = "IsvId";
  int ret = ons->OnsCloudGetAppkeyList(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ons;
}